

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedRows(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int *perm)

{
  bool bVar1;
  int iVar2;
  Representation RVar3;
  Status *pSVar4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int n;
  int i;
  Status in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  Status in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  SPxStatus stat;
  undefined4 in_stack_ffffffffffffffd0;
  Status in_stack_ffffffffffffffd4;
  uint local_14;
  
  iVar2 = Desc::nRows((Desc *)0x35c944);
  RVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rep(in_RDI->theLP);
  if (RVar3 == ROW) {
    for (local_14 = 0; (int)local_14 < iVar2; local_14 = local_14 + 1) {
      if ((in_RSI->nonzeroFactor).m_backend.data._M_elems[(long)(int)local_14 + -0x16] != local_14)
      {
        if ((int)(in_RSI->nonzeroFactor).m_backend.data._M_elems[(long)(int)local_14 + -0x16] < 0) {
          Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
          bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
          if (bVar1) {
            setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (SPxStatus)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
            in_RDI->matrixIsSetup = false;
            in_RDI->factorized = false;
            SPxOut::
            debug<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[39],_0>
                      (in_RDI,(char (*) [39])"DCHBAS07 Warning: deleting basic row!\n");
          }
        }
        else {
          pSVar4 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                   in_stack_ffffffffffffffbc);
          in_stack_ffffffffffffffd4 = *pSVar4;
          pSVar4 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                   in_stack_ffffffffffffffbc);
          *pSVar4 = in_stack_ffffffffffffffd4;
        }
      }
    }
  }
  else {
    in_RDI->factorized = false;
    in_RDI->matrixIsSetup = false;
    for (local_14 = 0; (int)local_14 < iVar2; local_14 = local_14 + 1) {
      if ((in_RSI->nonzeroFactor).m_backend.data._M_elems[(long)(int)local_14 + -0x16] != local_14)
      {
        if ((int)(in_RSI->nonzeroFactor).m_backend.data._M_elems[(long)(int)local_14 + -0x16] < 0) {
          stat = (SPxStatus)((ulong)in_RDI->theLP >> 0x20);
          Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
          bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
          if (!bVar1) {
            setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),stat);
          }
        }
        else {
          pSVar4 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                   in_stack_ffffffffffffffbc);
          in_stack_ffffffffffffffc4 = *pSVar4;
          pSVar4 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                   in_stack_ffffffffffffffbc);
          *pSVar4 = in_stack_ffffffffffffffc4;
        }
      }
    }
  }
  reDim(in_RSI);
  return;
}

Assistant:

void SPxBasisBase<R>::removedRows(const int perm[])
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   int i;
   int n = thedesc.nRows();

   if(theLP->rep() == SPxSolverBase<R>::ROW)
   {
      for(i = 0; i < n; ++i)
      {
         if(perm[i] != i)
         {
            if(perm[i] < 0)                // row got removed
            {
               if(theLP->isBasic(thedesc.rowStatus(i)))
               {
                  setStatus(NO_PROBLEM);
                  factorized = matrixIsSetup = false;
                  SPxOut::debug(this, "DCHBAS07 Warning: deleting basic row!\n");
               }
            }
            else                            // row was moved
               thedesc.rowStatus(perm[i]) = thedesc.rowStatus(i);
         }
      }
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::COLUMN);

      factorized    = false;
      matrixIsSetup = false;

      for(i = 0; i < n; ++i)
      {
         if(perm[i] != i)
         {
            if(perm[i] < 0)                // row got removed
            {
               if(!theLP->isBasic(thedesc.rowStatus(i)))
                  setStatus(NO_PROBLEM);
            }
            else                            // row was moved
               thedesc.rowStatus(perm[i]) = thedesc.rowStatus(i);
         }
      }
   }

   reDim();
}